

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_opaq(lyd_node *parent,ly_ctx *ctx,char *name,char *value,char *prefix,
                   char *module_name,lyd_node **node)

{
  lyd_node **pplVar1;
  lyd_node *module_key;
  char *prefix_00;
  char *value_00;
  char *name_00;
  char *ctx_00;
  int iVar2;
  size_t name_len;
  size_t module_key_len;
  size_t value_len;
  size_t local_a8;
  lyd_node **local_80;
  lyd_node **local_78;
  lyd_node **local_70;
  uint32_t local_5c;
  LY_ERR ret__;
  uint32_t hints;
  lyd_node *ret;
  char *module_name_local;
  char *prefix_local;
  char *value_local;
  char *name_local;
  ly_ctx *ctx_local;
  lyd_node *parent_local;
  
  _ret__ = (lyd_node *)0x0;
  local_5c = 0;
  ret = (lyd_node *)module_name;
  module_name_local = prefix;
  prefix_local = value;
  value_local = name;
  name_local = (char *)ctx;
  ctx_local = (ly_ctx *)parent;
  if ((parent == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || ctx",
           "lyd_new_opaq");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((parent == (lyd_node *)0x0) && (node == (lyd_node **)0x0)) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || node","lyd_new_opaq");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_opaq");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (module_name == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module_name","lyd_new_opaq");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((prefix == (char *)0x0) || (iVar2 = strcmp(prefix,module_name), iVar2 == 0)) {
    if ((name_local != (char *)0x0) && (ctx_local != (ly_ctx *)0x0)) {
      if ((ctx_local->dict).lock.__align == 0) {
        pplVar1 = (ctx_local->unres).implementing.field_2.dnodes;
      }
      else {
        pplVar1 = (lyd_node **)**(long **)((ctx_local->dict).lock.__align + 8);
      }
      if (pplVar1 != (lyd_node **)0x0) {
        if (ctx_local == (ly_ctx *)0x0) {
          local_78 = (lyd_node **)0x0;
        }
        else {
          if ((ctx_local->dict).lock.__align == 0) {
            local_70 = (ctx_local->unres).implementing.field_2.dnodes;
          }
          else {
            local_70 = (lyd_node **)**(long **)((ctx_local->dict).lock.__align + 8);
          }
          local_78 = local_70;
        }
        if ((lyd_node **)name_local != local_78) {
          ly_log((ly_ctx *)name_local,LY_LLERR,LY_EINVAL,
                 "Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (name_local == (char *)0x0) {
      if ((ctx_local->dict).lock.__align == 0) {
        local_80 = (ctx_local->unres).implementing.field_2.dnodes;
      }
      else {
        local_80 = (lyd_node **)**(undefined8 **)((ctx_local->dict).lock.__align + 8);
      }
      name_local = (char *)local_80;
    }
    if (prefix_local == (char *)0x0) {
      prefix_local = "";
    }
    else {
      iVar2 = strcmp(prefix_local,"[null]");
      if (iVar2 == 0) {
        local_5c = 0x40;
      }
    }
    ctx_00 = name_local;
    name_00 = value_local;
    name_len = strlen(value_local);
    prefix_00 = module_name_local;
    if (module_name_local == (char *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = strlen(module_name_local);
    }
    module_key = ret;
    module_key_len = strlen((char *)ret);
    value_00 = prefix_local;
    value_len = strlen(prefix_local);
    parent_local._4_4_ =
         lyd_create_opaq((ly_ctx *)ctx_00,name_00,name_len,prefix_00,local_a8,(char *)module_key,
                         module_key_len,value_00,value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,
                         local_5c,(lyd_node **)&ret__);
    if (parent_local._4_4_ == LY_SUCCESS) {
      if (ctx_local != (ly_ctx *)0x0) {
        lyd_insert_node((lyd_node *)ctx_local,(lyd_node **)0x0,_ret__,1);
      }
      if (node != (lyd_node **)0x0) {
        *node = _ret__;
      }
      parent_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    ly_log((ly_ctx *)name_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "!prefix || !strcmp(prefix, module_name)","lyd_new_opaq");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_opaq(struct lyd_node *parent, const struct ly_ctx *ctx, const char *name, const char *value,
        const char *prefix, const char *module_name, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    uint32_t hints = 0;

    LY_CHECK_ARG_RET(ctx, parent || ctx, parent || node, name, module_name, !prefix || !strcmp(prefix, module_name), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, parent ? LYD_CTX(parent) : NULL, LY_EINVAL);

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (!value) {
        value = "";
    } else if (!strcmp(value, "[null]")) {
        hints |= LYD_VALHINT_EMPTY;
    }

    LY_CHECK_RET(lyd_create_opaq(ctx, name, strlen(name), prefix, prefix ? strlen(prefix) : 0, module_name,
            strlen(module_name), value, strlen(value), NULL, LY_VALUE_JSON, NULL, hints, &ret));
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_LAST);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}